

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

void mp_zero(mp_int *a)

{
  mp_digit *tmp;
  int n;
  mp_int *a_local;
  
  a->sign = 0;
  a->used = 0;
  tmp = a->dp;
  for (n = 0; n < a->alloc; n = n + 1) {
    *tmp = 0;
    tmp = tmp + 1;
  }
  return;
}

Assistant:

void mp_zero (mp_int * a)
{
  int       n;
  mp_digit *tmp;

  a->sign = MP_ZPOS;
  a->used = 0;

  tmp = a->dp;
  for (n = 0; n < a->alloc; n++) {
     *tmp++ = 0;
  }
}